

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

bool __thiscall
tlx::CmdlineParser::ArgumentBytes64::process(ArgumentBytes64 *this,int *argc,char ***argv)

{
  bool bVar1;
  char ***argv_local;
  int *argc_local;
  ArgumentBytes64 *this_local;
  
  if (*argc == 0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = parse_si_iec_units(**argv,this->dest_,'\0');
    if (bVar1) {
      *argc = *argc + -1;
      *argv = *argv + 1;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool process(int& argc, const char* const*& argv) final { // NOLINT
        if (argc == 0)
            return false;
        if (parse_si_iec_units(argv[0], &dest_)) {
            --argc, ++argv;
            return true;
        }
        else {
            return false;
        }
    }